

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# from_struct.cpp
# Opt level: O0

bool duckdb::StructToUnionCast::AllowImplicitCastFromStruct(LogicalType *source,LogicalType *target)

{
  LogicalTypeId LVar1;
  size_type sVar2;
  size_type sVar3;
  reference this;
  reference pvVar4;
  LogicalType *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *field_name;
  LogicalType *field;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *target_field_name;
  LogicalType *target_field;
  idx_t i;
  child_list_t<LogicalType> fields;
  child_list_t<LogicalType> target_fields;
  LogicalType *in_stack_ffffffffffffff08;
  undefined6 in_stack_ffffffffffffff10;
  byte in_stack_ffffffffffffff16;
  undefined1 in_stack_ffffffffffffff17;
  string *in_stack_ffffffffffffff18;
  string *psVar5;
  undefined4 in_stack_ffffffffffffff20;
  byte in_stack_ffffffffffffff24;
  byte bVar6;
  undefined1 in_stack_ffffffffffffff25;
  undefined1 in_stack_ffffffffffffff26;
  undefined1 in_stack_ffffffffffffff27;
  ulong local_60;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  local_48 [24];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  local_30 [47];
  byte local_1;
  
  LVar1 = LogicalType::id(in_RDI);
  if (LVar1 == STRUCT) {
    StructType::GetChildTypes_abi_cxx11_
              ((LogicalType *)
               CONCAT17(in_stack_ffffffffffffff17,
                        CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)));
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
              *)CONCAT17(in_stack_ffffffffffffff17,
                         CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)),
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
              *)in_stack_ffffffffffffff08);
    StructType::GetChildTypes_abi_cxx11_
              ((LogicalType *)
               CONCAT17(in_stack_ffffffffffffff17,
                        CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)));
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
              *)CONCAT17(in_stack_ffffffffffffff17,
                         CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)),
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
              *)in_stack_ffffffffffffff08);
    sVar2 = ::std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
            ::size(local_30);
    sVar3 = ::std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
            ::size(local_48);
    if (sVar2 == sVar3) {
      for (local_60 = 0;
          sVar2 = ::std::
                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                  ::size(local_30), local_60 < sVar2; local_60 = local_60 + 1) {
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
        ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                      *)CONCAT17(in_stack_ffffffffffffff17,
                                 CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)),
                     (size_type)in_stack_ffffffffffffff08);
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
        ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                      *)CONCAT17(in_stack_ffffffffffffff17,
                                 CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)),
                     (size_type)in_stack_ffffffffffffff08);
        this = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
               ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                             *)CONCAT17(in_stack_ffffffffffffff17,
                                        CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10
                                                )),(size_type)in_stack_ffffffffffffff08);
        psVar5 = (string *)&this->second;
        pvVar4 = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                 ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                               *)CONCAT17(in_stack_ffffffffffffff17,
                                          CONCAT16(in_stack_ffffffffffffff16,
                                                   in_stack_ffffffffffffff10)),
                              (size_type)in_stack_ffffffffffffff08);
        LVar1 = (LogicalTypeId)((ulong)pvVar4 >> 0x38);
        if (local_60 == 0) {
          in_stack_ffffffffffffff27 =
               LogicalType::operator!=
                         ((LogicalType *)
                          CONCAT17(in_stack_ffffffffffffff17,
                                   CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)),
                          in_stack_ffffffffffffff08);
          if ((bool)in_stack_ffffffffffffff27) {
            local_1 = 0;
            goto LAB_01a1efab;
          }
        }
        else {
          in_stack_ffffffffffffff26 =
               StringUtil::CIEquals
                         ((string *)
                          CONCAT17(in_stack_ffffffffffffff27,
                                   CONCAT16(in_stack_ffffffffffffff26,
                                            CONCAT15(in_stack_ffffffffffffff25,
                                                     CONCAT14(in_stack_ffffffffffffff24,
                                                              in_stack_ffffffffffffff20)))),
                          in_stack_ffffffffffffff18);
          if (!(bool)in_stack_ffffffffffffff26) {
            local_1 = 0;
            goto LAB_01a1efab;
          }
          in_stack_ffffffffffffff25 =
               LogicalType::operator!=
                         ((LogicalType *)
                          CONCAT17(in_stack_ffffffffffffff17,
                                   CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)),
                          in_stack_ffffffffffffff08);
          bVar6 = 0;
          in_stack_ffffffffffffff24 = bVar6;
          if ((bool)in_stack_ffffffffffffff25) {
            LogicalType::LogicalType((LogicalType *)this,LVar1);
            bVar6 = LogicalType::operator!=
                              ((LogicalType *)
                               CONCAT17(in_stack_ffffffffffffff17,
                                        CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10
                                                )),in_stack_ffffffffffffff08);
            in_stack_ffffffffffffff17 = bVar6;
            in_stack_ffffffffffffff24 = bVar6;
            LogicalType::~LogicalType((LogicalType *)0x1a1ef35);
            in_stack_ffffffffffffff18 = psVar5;
          }
          in_stack_ffffffffffffff16 = bVar6;
          if ((bVar6 & 1) != 0) {
            local_1 = 0;
            goto LAB_01a1efab;
          }
        }
      }
      local_1 = 1;
    }
    else {
      local_1 = 0;
    }
LAB_01a1efab:
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
               *)0x1a1efb8);
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
               *)0x1a1efc5);
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool StructToUnionCast::AllowImplicitCastFromStruct(const LogicalType &source, const LogicalType &target) {
	if (source.id() != LogicalTypeId::STRUCT) {
		return false;
	}
	auto target_fields = StructType::GetChildTypes(target);
	auto fields = StructType::GetChildTypes(source);
	if (target_fields.size() != fields.size()) {
		// Struct should have the same amount of fields as the union
		return false;
	}
	for (idx_t i = 0; i < target_fields.size(); i++) {
		auto &target_field = target_fields[i].second;
		auto &target_field_name = target_fields[i].first;
		auto &field = fields[i].second;
		auto &field_name = fields[i].first;
		if (i == 0) {
			// For the tag field we don't accept a type substitute as varchar
			if (target_field != field) {
				return false;
			}
			continue;
		}
		if (!StringUtil::CIEquals(target_field_name, field_name)) {
			return false;
		}
		if (target_field != field && field != LogicalType::VARCHAR) {
			// We allow the field to be VARCHAR, since unsupported types get cast to VARCHAR by EXPORT DATABASE (format
			// PARQUET) i.e UNION(a BIT) becomes STRUCT(a VARCHAR)
			return false;
		}
	}
	return true;
}